

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

type __thiscall
jsoncons::
order_preserving_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>
::try_emplace<std::allocator<char>,char_const(&)[4]>
          (order_preserving_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>
           *this,string_view_type *name,char (*args) [4])

{
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  type tVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _Var1._M_current =
       (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
          ::find((order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                  *)this,name);
  if (_Var1._M_current ==
      *(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        **)(this + 0x10)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,name->_M_str,name->_M_str + name->_M_len);
    std::
    vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::emplace_back<std::__cxx11::string,char_const(&)[4]>
              ((vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)(this + 8),&local_40,args);
    std::__cxx11::string::~string((string *)&local_40);
    _Var1._M_current =
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)(*(long *)(this + 0x10) + -0x30);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar2 = 0;
  }
  tVar3._8_8_ = uVar2;
  tVar3.first._M_current = _Var1._M_current;
  return tVar3;
}

Assistant:

typename std::enable_if<std::allocator_traits<A>::is_always_equal::value,std::pair<iterator,bool>>::type
        try_emplace(const string_view_type& name, Args&&... args)
        {
            auto it = find(name);
            if (it == members_.end())
            {
                members_.emplace_back(key_type(name.begin(), name.end()), std::forward<Args>(args)...);
                auto pos = members_.begin() + (members_.size()-1);
                return std::make_pair(pos,true);
            }
            else
            {
                return std::make_pair(it,false);
            }
        }